

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::AutomaticCoinSelection
          (Result<wallet::SelectionResult> *__return_storage_ptr__,CWallet *wallet,
          CoinsResult *available_coins,CAmount *value_to_select,
          CoinSelectionParams *coin_selection_params)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Chain *pCVar5;
  uint uVar6;
  pointer pOVar7;
  pointer pSVar8;
  bool bVar9;
  uint uVar10;
  size_t sVar11;
  CAmount CVar12;
  CAmount CVar13;
  iterator iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  pointer __k;
  OutputGroup *group;
  pointer this;
  long in_FS_OFFSET;
  initializer_list<wallet::SelectionFilter> __l;
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  res_detailed_errors;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> discarded_groups;
  vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> ordered_filters;
  uint limit_descendant_count;
  uint limit_ancestor_count;
  FilteredOutputGroups filtered_groups;
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  local_1a8;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> local_188;
  vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> local_168;
  int local_150;
  int local_14c;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138;
  uint7 uStack_137;
  undefined8 uStack_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined8 local_117;
  undefined4 local_10f;
  undefined2 local_10b;
  uchar local_109;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  uint7 uStack_f7;
  undefined8 uStack_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined8 local_d7;
  undefined4 local_cf;
  undefined2 local_cb;
  uchar local_c9;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  undefined1 auStack_80 [12];
  undefined4 uStack_74;
  undefined1 uStack_70;
  undefined7 uStack_6f;
  bool local_68;
  undefined7 uStack_67;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 local_48;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_14c = 0;
  local_150 = 0;
  pCVar5 = wallet->m_chain;
  if (pCVar5 == (Chain *)0x0) {
LAB_0023d38f:
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  (**(code **)(*(long *)pCVar5 + 200))(pCVar5,&local_14c,&local_150);
  uVar17 = local_14c + (uint)(local_14c == 0);
  uVar10 = local_150 + (uint)(local_150 == 0);
  local_88 = (undefined1  [8])(auStack_80 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"-walletrejectlongchains","");
  bVar9 = ArgsManager::GetBoolArg(&gArgs,(string *)local_88,true);
  if (local_88 != (undefined1  [8])(auStack_80 + 8)) {
    operator_delete((void *)local_88,stack0xffffffffffffff88 + 1);
  }
  if ((coin_selection_params->m_avoid_partial_spends == true) &&
     (sVar11 = CoinsResult::Size(available_coins), 100 < sVar11)) {
    CoinsResult::Shuffle(available_coins,coin_selection_params->rng_fast);
  }
  local_88 = (undefined1  [8])0x600000001;
  local_68 = false;
  _auStack_80 = (undefined1  [16])0x0;
  uStack_70 = '\0';
  local_60 = 0x100000001;
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  local_40 = 1;
  __l._M_len = 2;
  __l._M_array = (iterator)local_88;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            (&local_168,__l,(allocator_type *)&local_188);
  if (wallet->m_spend_zero_conf_change == true) {
    local_88 = (undefined1  [8])0x100000000;
    auStack_80._0_8_ = 2;
    stack0xffffffffffffff88 = 2;
    uStack_70 = '\0';
    local_68 = true;
    if (local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
      _M_realloc_insert<wallet::SelectionFilter>
                (&local_168,
                 (iterator)
                 local_168.
                 super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(SelectionFilter *)local_88);
    }
    else {
      *(ulong *)&(local_168.
                  super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->allow_mixed_output_types =
           CONCAT71(uStack_67,1);
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_descendants = 2;
      *(ulong *)&((local_168.
                   super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->filter).m_include_partial_groups =
           (ulong)(uint7)uStack_6f << 8;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_mine = 0;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_theirs = 1;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_ancestors = 2;
      local_168.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_168.
           super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    uVar6 = uVar17 / 3;
    if (3 < uVar17 / 3) {
      uVar6 = 4;
    }
    auStack_80._8_4_ = 4;
    if (uVar10 / 3 < 4) {
      auStack_80._8_4_ = uVar10 / 3;
    }
    local_88 = (undefined1  [8])0x100000000;
    auStack_80._0_8_ = CONCAT44(0,uVar6);
    uStack_74 = 0;
    uStack_70 = '\0';
    local_68 = true;
    if (local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
      _M_realloc_insert<wallet::SelectionFilter>
                (&local_168,
                 (iterator)
                 local_168.
                 super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(SelectionFilter *)local_88);
    }
    else {
      *(ulong *)&(local_168.
                  super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->allow_mixed_output_types =
           CONCAT71(uStack_67,1);
      uStack_74 = 0;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_descendants =
           stack0xffffffffffffff88;
      *(ulong *)&((local_168.
                   super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->filter).m_include_partial_groups =
           (ulong)(uint7)uStack_6f << 8;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_mine = 0;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_theirs = 1;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_ancestors = CONCAT44(0,uVar6);
      local_168.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_168.
           super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    auStack_80._0_8_ = ZEXT48(uVar17 >> 1);
    unique0x100002b1 = ZEXT48(uVar10 >> 1);
    local_88 = (undefined1  [8])0x100000000;
    uStack_70 = '\0';
    local_68 = true;
    if (local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
      _M_realloc_insert<wallet::SelectionFilter>
                (&local_168,
                 (iterator)
                 local_168.
                 super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(SelectionFilter *)local_88);
    }
    else {
      *(ulong *)&(local_168.
                  super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->allow_mixed_output_types =
           CONCAT71(uStack_67,1);
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_descendants = unique0x100002b1;
      *(ulong *)&((local_168.
                   super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->filter).m_include_partial_groups =
           (ulong)(uint7)uStack_6f << 8;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_mine = 0;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_theirs = 1;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_ancestors = auStack_80._0_8_;
      local_168.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_168.
           super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    uVar1 = (ulong)uVar17 - 1;
    uVar2 = (ulong)uVar10 - 1;
    local_88 = (undefined1  [8])0x100000000;
    stack0xffffffffffffff88 = uVar2;
    auStack_80._0_8_ = uVar1;
    uStack_70 = '\x01';
    local_68 = true;
    if (local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
      _M_realloc_insert<wallet::SelectionFilter>
                (&local_168,
                 (iterator)
                 local_168.
                 super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(SelectionFilter *)local_88);
    }
    else {
      *(ulong *)&(local_168.
                  super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->allow_mixed_output_types =
           CONCAT71(uStack_67,1);
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_descendants = uVar2;
      *(ulong *)&((local_168.
                   super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->filter).m_include_partial_groups =
           CONCAT71(uStack_6f,1);
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_mine = 0;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).conf_theirs = 1;
      ((local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish)->filter).max_ancestors = uVar1;
      local_168.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_168.
           super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (coin_selection_params->m_include_unsafe_inputs == true) {
      local_88 = (undefined1  [8])0x0;
      uStack_70 = '\x01';
      local_68 = true;
      if (local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
        _M_realloc_insert<wallet::SelectionFilter>
                  (&local_168,
                   (iterator)
                   local_168.
                   super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(SelectionFilter *)local_88);
      }
      else {
        *(ulong *)&(local_168.
                    super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->allow_mixed_output_types =
             CONCAT71(uStack_67,1);
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).max_descendants = uVar2;
        *(ulong *)&((local_168.
                     super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->filter).m_include_partial_groups =
             CONCAT71(uStack_6f,1);
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).conf_mine = 0;
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).conf_theirs = 0;
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).max_ancestors = uVar1;
        local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_168.
             super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    if (!bVar9) {
      local_88 = (undefined1  [8])0x100000000;
      auStack_80._8_4_ = 0xffffffff;
      auStack_80._0_8_ = 0xffffffffffffffff;
      uStack_74 = 0xffffffff;
      uStack_70 = '\x01';
      local_68 = true;
      if (local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
        _M_realloc_insert<wallet::SelectionFilter>
                  (&local_168,
                   (iterator)
                   local_168.
                   super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(SelectionFilter *)local_88);
      }
      else {
        *(ulong *)&(local_168.
                    super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->allow_mixed_output_types =
             CONCAT71(uStack_67,1);
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).max_descendants =
             stack0xffffffffffffff88;
        *(ulong *)&((local_168.
                     super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->filter).m_include_partial_groups =
             CONCAT71(uStack_6f,1);
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).conf_mine = 0;
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).conf_theirs = 1;
        ((local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_finish)->filter).max_ancestors = 0xffffffffffffffff;
        local_168.
        super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_168.
             super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  local_188.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GroupOutputs((FilteredOutputGroups *)local_88,wallet,available_coins,coin_selection_params,
               &local_168,&local_188);
  pOVar7 = local_188.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_188.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_188.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar16 = 0;
    lVar15 = 0;
  }
  else {
    lVar15 = 0;
    lVar16 = 0;
    this = local_188.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      CVar12 = OutputGroup::GetSelectionAmount(this);
      if (((ulong)uVar17 <= this->m_ancestors) || ((ulong)uVar10 <= this->m_descendants)) {
        CVar13 = OutputGroup::GetSelectionAmount(this);
        lVar16 = lVar16 + CVar13;
      }
      lVar15 = lVar15 + CVar12;
      this = this + 1;
    } while (this != pOVar7);
  }
  pSVar8 = local_168.
           super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (available_coins->total_amount - lVar15 < *value_to_select) {
    if (lVar16 < *value_to_select) {
      local_108 = &local_f8;
      local_e8 = &local_d8;
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
           (undefined1 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10)
      ;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                0x10) = (ulong)uStack_f7 << 8;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
           uStack_f0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) = 0;
      local_100 = 0;
      local_f8 = 0;
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
           (undefined1 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30)
      ;
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._M_first._M_storage.
      _M_storage[0x30] = '\0';
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x31) =
           local_d7;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x39) =
           local_cf;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x3d) =
           local_cb;
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._M_first._M_storage.
      _M_storage[0x3f] = local_c9;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) = 0
      ;
      local_e0 = 0;
      local_d8 = 0;
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
    }
    else {
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "Unconfirmed UTXOs are available, but spending them creates a chain of transactions that will be rejected by the mempool"
                 ,"");
      paVar4 = &local_a8.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_a8._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,
                   "Unconfirmed UTXOs are available, but spending them creates a chain of transactions that will be rejected by the mempool"
                   ,"");
      }
      else {
        local_1a8.
        super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)
             "Unconfirmed UTXOs are available, but spending them creates a chain of transactions that will be rejected by the mempool"
        ;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_a8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_1a8);
      }
      puVar3 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = puVar3;
      if (local_c8 == &local_b8) {
        *puVar3 = CONCAT71(uStack_b7,local_b8);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
             uStack_b0;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = local_c8;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u
                  + 0x10) = CONCAT71(uStack_b7,local_b8);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
           local_c0;
      local_c0 = 0;
      local_b8 = 0;
      puVar3 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
           puVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == paVar4) {
        *puVar3 = CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                           local_a8.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) =
             local_a8.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
             local_a8._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u
                  + 0x30) =
             CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,local_a8.field_2._M_local_buf[0])
        ;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) =
           local_a8._M_string_length;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
      local_c8 = &local_b8;
      local_a8._M_dataplus._M_p = (pointer)paVar4;
    }
    goto LAB_0023d332;
  }
  local_1a8.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_168.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_168.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_0023d190:
    local_148 = &local_138;
    local_128 = &local_118;
    *(undefined1 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10);
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
              0x10) = (ulong)uStack_137 << 8;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
         uStack_130;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) = 0;
    local_140 = 0;
    local_138 = 0;
    *(undefined1 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30);
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
    super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._M_first._M_storage.
    _M_storage[0x30] = '\0';
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x31) =
         local_117;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x39) =
         local_10f;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x3d) =
         local_10b;
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
    super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._M_first._M_storage.
    _M_storage[0x3f] = local_109;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) = 0;
    local_120 = 0;
    local_118 = 0;
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
    super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
  }
  else {
    __k = local_168.
          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar14 = std::
               _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
               ::find((_Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                       *)local_88,&__k->filter);
      if (iVar14._M_node != (_Base_ptr)auStack_80) {
        if (wallet->m_chain == (Chain *)0x0) goto LAB_0023d38f;
        AttemptSelection(__return_storage_ptr__,wallet->m_chain,value_to_select,
                         (OutputGroupTypeMap *)(iVar14._M_node + 2),coin_selection_params,
                         __k->allow_mixed_output_types);
        if ((__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index == '\x01')
        goto LAB_0023d200;
        bVar9 = HasErrorMsg(__return_storage_ptr__);
        if (bVar9) {
          std::
          vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
          ::emplace_back<util::Result<wallet::SelectionResult>>
                    ((vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
                      *)&local_1a8,__return_storage_ptr__);
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                          __return_storage_ptr__);
      }
      __k = __k + 1;
    } while (__k != pSVar8);
    if (local_1a8.
        super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1a8.
        super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0023d190;
    std::__detail::__variant::_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult>::
    _Move_ctor_base((_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                    __return_storage_ptr__,
                    (_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                    local_1a8.
                    super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0023d200:
  std::
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  ::~vector(&local_1a8);
LAB_0023d332:
  std::
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~_Rb_tree((_Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
               *)local_88);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_188);
  if (local_168.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_start != (SelectionFilter *)0x0) {
    operator_delete(local_168.
                    super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> AutomaticCoinSelection(const CWallet& wallet, CoinsResult& available_coins, const CAmount& value_to_select, const CoinSelectionParams& coin_selection_params)
{
    unsigned int limit_ancestor_count = 0;
    unsigned int limit_descendant_count = 0;
    wallet.chain().getPackageLimits(limit_ancestor_count, limit_descendant_count);
    const size_t max_ancestors = (size_t)std::max<int64_t>(1, limit_ancestor_count);
    const size_t max_descendants = (size_t)std::max<int64_t>(1, limit_descendant_count);
    const bool fRejectLongChains = gArgs.GetBoolArg("-walletrejectlongchains", DEFAULT_WALLET_REJECT_LONG_CHAINS);

    // Cases where we have 101+ outputs all pointing to the same destination may result in
    // privacy leaks as they will potentially be deterministically sorted. We solve that by
    // explicitly shuffling the outputs before processing
    if (coin_selection_params.m_avoid_partial_spends && available_coins.Size() > OUTPUT_GROUP_MAX_ENTRIES) {
        available_coins.Shuffle(coin_selection_params.rng_fast);
    }

    // Coin Selection attempts to select inputs from a pool of eligible UTXOs to fund the
    // transaction at a target feerate. If an attempt fails, more attempts may be made using a more
    // permissive CoinEligibilityFilter.
    {
        // Place coins eligibility filters on a scope increasing order.
        std::vector<SelectionFilter> ordered_filters{
                // If possible, fund the transaction with confirmed UTXOs only. Prefer at least six
                // confirmations on outputs received from other wallets and only spend confirmed change.
                {CoinEligibilityFilter(1, 6, 0), /*allow_mixed_output_types=*/false},
                {CoinEligibilityFilter(1, 1, 0)},
        };
        // Fall back to using zero confirmation change (but with as few ancestors in the mempool as
        // possible) if we cannot fund the transaction otherwise.
        if (wallet.m_spend_zero_conf_change) {
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, 2)});
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, std::min(size_t{4}, max_ancestors/3), std::min(size_t{4}, max_descendants/3))});
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, max_ancestors/2, max_descendants/2)});
            // If partial groups are allowed, relax the requirement of spending OutputGroups (groups
            // of UTXOs sent to the same address, which are obviously controlled by a single wallet)
            // in their entirety.
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, max_ancestors-1, max_descendants-1, /*include_partial=*/true)});
            // Try with unsafe inputs if they are allowed. This may spend unconfirmed outputs
            // received from other wallets.
            if (coin_selection_params.m_include_unsafe_inputs) {
                ordered_filters.push_back({CoinEligibilityFilter(/*conf_mine=*/0, /*conf_theirs*/0, max_ancestors-1, max_descendants-1, /*include_partial=*/true)});
            }
            // Try with unlimited ancestors/descendants. The transaction will still need to meet
            // mempool ancestor/descendant policy to be accepted to mempool and broadcasted, but
            // OutputGroups use heuristics that may overestimate ancestor/descendant counts.
            if (!fRejectLongChains) {
                ordered_filters.push_back({CoinEligibilityFilter(0, 1, std::numeric_limits<uint64_t>::max(),
                                                                   std::numeric_limits<uint64_t>::max(),
                                                                   /*include_partial=*/true)});
            }
        }

        // Group outputs and map them by coin eligibility filter
        std::vector<OutputGroup> discarded_groups;
        FilteredOutputGroups filtered_groups = GroupOutputs(wallet, available_coins, coin_selection_params, ordered_filters, discarded_groups);

        // Check if we still have enough balance after applying filters (some coins might be discarded)
        CAmount total_discarded = 0;
        CAmount total_unconf_long_chain = 0;
        for (const auto& group : discarded_groups) {
            total_discarded += group.GetSelectionAmount();
            if (group.m_ancestors >= max_ancestors || group.m_descendants >= max_descendants) total_unconf_long_chain += group.GetSelectionAmount();
        }

        if (CAmount total_amount = available_coins.GetTotalAmount() - total_discarded < value_to_select) {
            // Special case, too-long-mempool cluster.
            if (total_amount + total_unconf_long_chain > value_to_select) {
                return util::Error{_("Unconfirmed UTXOs are available, but spending them creates a chain of transactions that will be rejected by the mempool")};
            }
            return util::Error{}; // General "Insufficient Funds"
        }

        // Walk-through the filters until the solution gets found.
        // If no solution is found, return the first detailed error (if any).
        // future: add "error level" so the worst one can be picked instead.
        std::vector<util::Result<SelectionResult>> res_detailed_errors;
        for (const auto& select_filter : ordered_filters) {
            auto it = filtered_groups.find(select_filter.filter);
            if (it == filtered_groups.end()) continue;
            if (auto res{AttemptSelection(wallet.chain(), value_to_select, it->second,
                                          coin_selection_params, select_filter.allow_mixed_output_types)}) {
                return res; // result found
            } else {
                // If any specific error message appears here, then something particularly wrong might have happened.
                // Save the error and continue the selection process. So if no solutions gets found, we can return
                // the detailed error to the upper layers.
                if (HasErrorMsg(res)) res_detailed_errors.emplace_back(std::move(res));
            }
        }

        // Return right away if we have a detailed error
        if (!res_detailed_errors.empty()) return std::move(res_detailed_errors.front());


        // General "Insufficient Funds"
        return util::Error{};
    }
}